

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this,QByteArray *array)

{
  long lVar1;
  QObject *parent;
  QXmlStreamWriterPrivate *byteArray;
  QIODevice *pQVar2;
  long in_FS_OFFSET;
  QXmlStreamWriterPrivate *d;
  undefined4 in_stack_ffffffffffffff98;
  OpenModeFlag in_stack_ffffffffffffff9c;
  unique_ptr<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
  *in_stack_ffffffffffffffa0;
  QXmlStreamWriter *in_stack_ffffffffffffffc8;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffffd0;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = (QObject *)operator_new(0xe0);
  QXmlStreamWriterPrivate::QXmlStreamWriterPrivate
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<QXmlStreamWriterPrivate,std::default_delete<QXmlStreamWriterPrivate>>::
  unique_ptr<std::default_delete<QXmlStreamWriterPrivate>,void>
            (in_stack_ffffffffffffffa0,
             (pointer)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  byteArray = d_func((QXmlStreamWriter *)0x64ddb9);
  pQVar2 = (QIODevice *)operator_new(0x10);
  QBuffer::QBuffer((QBuffer *)in_stack_ffffffffffffffd0,(QByteArray *)byteArray,parent);
  byteArray->device = pQVar2;
  pQVar2 = byteArray->device;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)pQVar2,in_stack_ffffffffffffff9c);
  (**(code **)(*(long *)&(pQVar2->super_QObject)._vptr_QObject + 0x68))(pQVar2,local_c);
  *(ushort *)&byteArray->field_0x78 = *(ushort *)&byteArray->field_0x78 | 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter(QByteArray *array)
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
    Q_D(QXmlStreamWriter);
    d->device = new QBuffer(array);
    d->device->open(QIODevice::WriteOnly);
    d->deleteDevice = true;
}